

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_threadpool.cpp
# Opt level: O0

int __thiscall stc_tn_callbackobj::operator()(stc_tn_callbackobj *this,int n)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  id local_28;
  longlong local_20;
  longlong tid;
  stc_tn_callbackobj *psStack_10;
  int n_local;
  stc_tn_callbackobj *this_local;
  
  tid._4_4_ = n;
  psStack_10 = this;
  local_28 = std::this_thread::get_id();
  local_20 = tid_to_ll(&local_28);
  pLVar3 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar3);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","operator()",0x25);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/threadpool/tests/test_threadpool.cpp"
                      ,"operator()",0x25,LOG_LEVEL_INFO,
                      "[tid:%lld]  hello, stc_tn_callbackobj! ret value will be %d \n",local_20,
                      this->ret_val);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  return this->ret_val;
}

Assistant:

int operator()(int n) {
        long long tid = tid_to_ll(this_thread::get_id());
        LOG_INFO("[tid:%lld]  hello, stc_tn_callbackobj! ret value will be %d \n", tid, ret_val);
		return ret_val;
	}